

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_text(lyout *out,int level,char *name,char *text,int singleline,int closed)

{
  char *pcVar1;
  size_t sVar2;
  char *local_40;
  char *t;
  char *s;
  int closed_local;
  int singleline_local;
  char *text_local;
  char *name_local;
  int level_local;
  lyout *out_local;
  
  local_40 = text;
  if (singleline == 0) {
    ly_print(out,"%*s%s\n",(ulong)(uint)(level << 1),"",name);
    name_local._4_4_ = level + 1;
    ly_print(out,"%*s\"",(ulong)(uint)(name_local._4_4_ * 2),"");
  }
  else {
    ly_print(out,"%*s%s \"",(ulong)(uint)(level << 1),"",name);
    name_local._4_4_ = level;
  }
  while (pcVar1 = strchr(local_40,10), pcVar1 != (char *)0x0) {
    yang_encode(out,local_40,(int)pcVar1 - (int)local_40);
    ly_print(out,"\n");
    local_40 = pcVar1 + 1;
    if (*local_40 != '\n') {
      ly_print(out,"%*s ",(ulong)(uint)(name_local._4_4_ << 1),"");
    }
  }
  sVar2 = strlen(local_40);
  yang_encode(out,local_40,(int)sVar2);
  if (closed == 0) {
    ly_print(out,"\"");
  }
  else {
    ly_print(out,"\";\n");
  }
  return;
}

Assistant:

static void
yang_print_text(struct lyout *out, int level, const char *name, const char *text, int singleline, int closed)
{
    const char *s, *t;

    if (singleline) {
        ly_print(out, "%*s%s \"", LEVEL, INDENT, name);
    } else {
        ly_print(out, "%*s%s\n", LEVEL, INDENT, name);
        level++;

        ly_print(out, "%*s\"", LEVEL, INDENT);
    }
    t = text;
    while ((s = strchr(t, '\n'))) {
        yang_encode(out, t, s - t);
        ly_print(out, "\n");
        t = s + 1;
        if (*t != '\n') {
            ly_print(out, "%*s ", LEVEL, INDENT);
        }
    }

    yang_encode(out, t, strlen(t));
    if (closed) {
        ly_print(out, "\";\n");
    } else {
        ly_print(out, "\"");
    }
    level--;

}